

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

int Tas_ManSolveArray(Tas_Man_t *p,Vec_Ptr_t *vObjs)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int local_34;
  int RetValue;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vObjs_local;
  Tas_Man_t *p_local;
  
  local_34 = 0;
  s_Counter2 = 0;
  s_Counter3 = 0;
  s_Counter4 = 0;
  Vec_IntClear(p->vModel);
  for (RetValue = 0; iVar1 = Vec_PtrSize(vObjs), RetValue < iVar1; RetValue = RetValue + 1) {
    pGVar2 = (Gia_Obj_t *)Vec_PtrEntry(vObjs,RetValue);
    pGVar3 = Gia_ManConst0(p->pAig);
    if (pGVar2 == pGVar3) {
      return 1;
    }
  }
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x59a,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x59b,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
  }
  if (((p->pClauses).iHead == 1) && ((p->pClauses).iTail == 1)) {
    (p->Pars).nBTThisNc = 0;
    (p->Pars).nJustThis = 0;
    (p->Pars).nBTThis = 0;
    for (RetValue = 0; iVar1 = Vec_PtrSize(vObjs), RetValue < iVar1; RetValue = RetValue + 1) {
      pGVar2 = (Gia_Obj_t *)Vec_PtrEntry(vObjs,RetValue);
      pGVar3 = Gia_ManConst1(p->pAig);
      if (pGVar2 != pGVar3) {
        pGVar3 = Gia_Regular(pGVar2);
        iVar1 = Tas_VarIsAssigned(pGVar3);
        if (iVar1 == 0) {
          Tas_ManAssign(p,pGVar2,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
        }
      }
    }
    iVar1 = Tas_ManSolve_rec(p,0);
    if ((iVar1 == 0) && (iVar1 = Tas_ManCheckLimits(p), iVar1 == 0)) {
      Tas_ManSaveModel(p,p->vModel);
    }
    else {
      local_34 = 1;
    }
    Tas_ManCancelUntil(p,0);
    (p->pJust).iTail = 0;
    (p->pJust).iHead = 0;
    (p->pClauses).iTail = 1;
    (p->pClauses).iHead = 1;
    if (0 < p->nClauses) {
      (p->pStore).iCur = 0x10;
      for (RetValue = 0; iVar1 = Vec_IntSize(p->vWatchLits), RetValue < iVar1;
          RetValue = RetValue + 1) {
        iVar1 = Vec_IntEntry(p->vWatchLits,RetValue);
        p->pWatches[iVar1] = 0;
      }
      Vec_IntClear(p->vWatchLits);
      p->nClauses = 0;
    }
    for (RetValue = 0; iVar1 = Vec_IntSize(p->vActiveVars), RetValue < iVar1;
        RetValue = RetValue + 1) {
      iVar1 = Vec_IntEntry(p->vActiveVars,RetValue);
      p->pActivity[iVar1] = 0.0;
    }
    Vec_IntClear(p->vActiveVars);
    (p->Pars).nBTTotal = (p->Pars).nBTThis + (p->Pars).nBTTotal;
    iVar1 = Abc_MaxInt((p->Pars).nJustTotal,(p->Pars).nJustThis);
    (p->Pars).nJustTotal = iVar1;
    iVar1 = Tas_ManCheckLimits(p);
    if (iVar1 != 0) {
      local_34 = -1;
    }
    return local_34;
  }
  __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                ,0x59c,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
}

Assistant:

int Tas_ManSolveArray( Tas_Man_t * p, Vec_Ptr_t * vObjs )
{
    Gia_Obj_t * pObj;
    int i, Entry, RetValue = 0;
    s_Counter2 = 0;
    s_Counter3 = 0;
    s_Counter4 = 0;
    Vec_IntClear( p->vModel );
    Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, i )
        if ( pObj == Gia_ManConst0(p->pAig) )
            return 1;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, i )
        if ( pObj != Gia_ManConst1(p->pAig) && !Tas_VarIsAssigned(Gia_Regular(pObj)) )
            Tas_ManAssign( p, pObj, 0, NULL, NULL );
    if ( !Tas_ManSolve_rec(p, 0) && !Tas_ManCheckLimits(p) )
        Tas_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Tas_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    // clauses
    if ( p->nClauses > 0 )
    {
        p->pStore.iCur = 16;
        Vec_IntForEachEntry( p->vWatchLits, Entry, i )
            p->pWatches[Entry] = 0;
        Vec_IntClear( p->vWatchLits );
        p->nClauses = 0;
    }
    // activity
    Vec_IntForEachEntry( p->vActiveVars, Entry, i )
        p->pActivity[Entry] = 0.0;
    Vec_IntClear( p->vActiveVars );
    // statistics
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Tas_ManCheckLimits( p ) )
        RetValue = -1;

//    printf( "%d ", Gia_ManObjNum(p->pAig) );
//    printf( "%d ", p->Pars.nBTThis );
//    printf( "%d ", p->Pars.nJustThis );
//    printf( "%d ", s_Counter2 );
//    printf( "%d ", s_Counter3 );
//    printf( "%d  ", s_Counter4 );
    return RetValue;
}